

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O1

void srunner_run_tagged(SRunner *sr,char *sname,char *tcname,char *include_tags,char *exclude_tags,
                       print_output print_mode)

{
  TTest *pTVar1;
  List *pLVar2;
  SRunner *pSVar3;
  List *pLVar4;
  uint uVar5;
  TF *pTVar6;
  List *pLVar7;
  SRunner *pSVar8;
  fork_status fVar9;
  int iVar10;
  uint uVar11;
  __pid_t __pid;
  clockid_t cVar12;
  __pid_t _Var13;
  Suite *s;
  TCase *tc;
  TestResult *pTVar14;
  TF *pTVar15;
  char *pcVar16;
  char *pcVar17;
  char cVar18;
  List *pLVar19;
  uint __sig;
  int status;
  timer_t timerid;
  timespec ts_end;
  timespec ts_start;
  uint local_100;
  int local_fc;
  char *local_f8;
  char *local_f0;
  TCase *local_e8;
  char *local_e0;
  uint local_d4;
  char *local_d0;
  List *local_c8;
  List *local_c0;
  SRunner *local_b8;
  timer_t local_b0;
  List *local_a8;
  Suite *local_a0;
  List *local_98;
  List *local_90;
  timespec *local_88;
  TF *local_80;
  timespec local_78;
  timespec local_68;
  itimerspec local_58;
  
  local_f8 = tcname;
  local_f0 = exclude_tags;
  if (tcname == (char *)0x0) {
    local_f8 = getenv("CK_RUN_CASE");
  }
  if (sname == (char *)0x0) {
    sname = getenv("CK_RUN_SUITE");
  }
  local_d0 = sname;
  if (include_tags == (char *)0x0) {
    include_tags = getenv("CK_INCLUDE_TAGS");
  }
  if (local_f0 == (char *)0x0) {
    local_f0 = getenv("CK_EXCLUDE_TAGS");
  }
  if (sr != (SRunner *)0x0) {
    local_e0 = include_tags;
    if (CK_ENV < print_mode) {
      eprintf("Bad print_mode argument to srunner_run_all: %d",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
              ,0x31e,(ulong)print_mode);
    }
    memset(&srunner_run_tagged::sigalarm_new_action,0,0x98);
    srunner_run_tagged::sigalarm_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(0xe,(sigaction *)&srunner_run_tagged::sigalarm_new_action,
              (sigaction *)&srunner_run_tagged::sigalarm_old_action);
    memset(&srunner_run_tagged::sigint_new_action,0,0x98);
    srunner_run_tagged::sigint_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(2,(sigaction *)&srunner_run_tagged::sigint_new_action,(sigaction *)&sigint_old_action)
    ;
    memset(&srunner_run_tagged::sigterm_new_action,0,0x98);
    srunner_run_tagged::sigterm_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(0xf,(sigaction *)&srunner_run_tagged::sigterm_new_action,
              (sigaction *)&sigterm_old_action);
    fVar9 = srunner_fork_status(sr);
    set_fork_status(fVar9);
    setup_messaging();
    srunner_init_logging(sr,print_mode);
    log_srunner_start(sr);
    pcVar16 = local_e0;
    pLVar19 = sr->slst;
    local_c0 = tag_string_to_list(local_e0);
    local_c8 = tag_string_to_list(local_f0);
    check_list_front(pLVar19);
    iVar10 = check_list_at_end(pLVar19);
    pLVar7 = pLVar19;
    pSVar8 = sr;
    pLVar2 = local_c0;
    pSVar3 = local_b8;
    pLVar4 = local_a8;
    while (local_b8 = pSVar8, local_a8 = pLVar7, local_c0 = pLVar2, iVar10 == 0) {
      s = (Suite *)check_list_val(pLVar19);
      if (((local_d0 == (char *)0x0) || (iVar10 = strcmp(local_d0,s->name), iVar10 == 0)) &&
         ((local_f8 == (char *)0x0 || (iVar10 = suite_tcase(s,local_f8), iVar10 != 0)))) {
        log_suite_start(sr,s);
        pLVar19 = s->tclst;
        local_a0 = s;
        check_list_front(pLVar19);
        iVar10 = check_list_at_end(pLVar19);
        pLVar4 = pLVar19;
        pLVar2 = local_98;
        while (local_98 = pLVar4, iVar10 == 0) {
          tc = (TCase *)check_list_val(pLVar19);
          if (((local_f8 == (char *)0x0) || (iVar10 = strcmp(local_f8,tc->name), iVar10 == 0)) &&
             (((pcVar16 == (char *)0x0 || (uVar11 = tcase_matching_tag(tc,local_c0), uVar11 != 0))
              && ((local_f0 == (char *)0x0 ||
                  (uVar11 = tcase_matching_tag(tc,local_c8), uVar11 == 0)))))) {
            set_fork_status(CK_NOFORK);
            pTVar14 = srunner_run_setup(tc->unch_sflst,CK_NOFORK,tc->name,"unchecked_setup");
            fVar9 = srunner_fork_status(sr);
            set_fork_status(fVar9);
            if ((pTVar14 == (TestResult *)0x0) || (pTVar14->rtype == CK_PASS)) {
              pLVar19 = tc->tflst;
              check_list_front(pLVar19);
              iVar10 = check_list_at_end(pLVar19);
              if (iVar10 == 0) {
                local_88 = &tc->timeout;
                local_e8 = tc;
                local_90 = pLVar19;
                do {
                  pTVar15 = (TF *)check_list_val(pLVar19);
                  iVar10 = pTVar15->loop_start;
                  pTVar6 = pTVar15;
                  if (iVar10 < pTVar15->loop_end) {
                    do {
                      local_80 = pTVar6;
                      log_test_start(sr,tc,pTVar15);
                      fVar9 = srunner_fork_status(sr);
                      if (fVar9 == CK_NOFORK) {
                        pTVar14 = tcase_run_tfun_nofork(sr,tc,pTVar15,iVar10);
                        goto LAB_00156d29;
                      }
                      if (fVar9 != CK_FORK) {
                        pcVar16 = "Bad fork status in SRunner";
                        iVar10 = 0x10b;
LAB_00157077:
                        eprintf(pcVar16,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
                                ,iVar10);
                      }
                      local_100 = 0;
                      local_68.tv_sec = 0;
                      local_68.tv_nsec = 0;
                      local_78.tv_sec = 0;
                      local_78.tv_nsec = 0;
                      local_fc = iVar10;
                      __pid = fork();
                      if (__pid == 0) {
                        setpgid(0,0);
                        group_pid = getpgrp();
                        pTVar14 = tcase_run_checked_setup(sr,tc);
                        free(pTVar14);
                        cVar12 = check_get_clockid();
                        clock_gettime(cVar12,&local_68);
                        pTVar1 = pTVar15->ttest;
                        tcase_fn_start(pTVar1->name,pTVar1->file,pTVar1->line);
                        (*pTVar15->ttest->fn)(local_fc);
                        cVar12 = check_get_clockid();
                        clock_gettime(cVar12,&local_78);
                        tcase_run_checked_teardown(tc);
                        send_duration_info(((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                                                         SEXT816(local_68.tv_nsec),8) >> 7) -
                                           (SUB164(SEXT816(-0x20c49ba5e353f7cf) *
                                                   SEXT816(local_68.tv_nsec),0xc) >> 0x1f)) +
                                           ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) *
                                                         SEXT816(local_78.tv_nsec),8) >> 7) -
                                           (SUB164(SEXT816(0x20c49ba5e353f7cf) *
                                                   SEXT816(local_78.tv_nsec),0xc) >> 0x1f)) +
                                           ((int)local_78.tv_sec - (int)local_68.tv_sec) * 1000000);
                        exit(0);
                      }
                      if (__pid == -1) {
                        pcVar16 = "Error in call to fork:";
                        iVar10 = 0x1e5;
                        goto LAB_00157077;
                      }
                      alarm_received = '\0';
                      group_pid = __pid;
                      cVar12 = check_get_clockid();
                      iVar10 = timer_create(cVar12,(sigevent *)0x0,&local_b0);
                      if (iVar10 != 0) {
                        pcVar16 = "Error in call to timer_create:";
                        iVar10 = 0x218;
                        goto LAB_00157077;
                      }
                      local_58.it_value.tv_sec = local_88->tv_sec;
                      local_58.it_value.tv_nsec = local_88->tv_nsec;
                      local_58.it_interval.tv_sec = 0;
                      local_58.it_interval.tv_nsec = 0;
                      iVar10 = timer_settime(local_b0,0,&local_58,(itimerspec *)0x0);
                      if (iVar10 != 0) {
                        pcVar16 = "Error in call to timer_settime:";
                        iVar10 = 0x210;
                        goto LAB_00157077;
                      }
                      do {
                        _Var13 = waitpid(__pid,(int *)&local_100,0);
                      } while (_Var13 == -1);
                      timer_delete(local_b0);
                      killpg(__pid,9);
                      uVar5 = local_100;
                      pcVar16 = tc->name;
                      pcVar17 = pTVar15->ttest->name;
                      uVar11 = pTVar15->signal;
                      local_d4 = (uint)pTVar15->allowed_exit_value;
                      __sig = local_100 & 0x7f;
                      iVar10 = __sig * 0x1000000 + 0x1000000;
                      pTVar14 = receive_test_result((uint)((local_100 & 0xff00) != 0 && __sig == 0
                                                          || __sig != uVar11 && 0x1ffffff < iVar10))
                      ;
                      sr = local_b8;
                      tc = local_e8;
                      if (pTVar14 == (TestResult *)0x0) {
                        pcVar16 = "Failed to receive test result";
                        iVar10 = 0x22c;
                        goto LAB_00157077;
                      }
                      pTVar14->tcname = pcVar16;
                      pTVar14->tname = pcVar17;
                      pTVar14->iter = local_fc;
                      if (iVar10 < 0x2000000) {
                        cVar18 = (char)(uVar5 >> 8);
                        pTVar15 = local_80;
                        iVar10 = local_fc;
                        if (uVar11 == 0) {
                          if (__sig == 0) {
                            if ((int)cVar18 == local_d4) {
                              pTVar14->rtype = CK_PASS;
                              if (pTVar14->msg != (char *)0x0) {
                                free(pTVar14->msg);
                              }
                              pcVar16 = strdup("Passed");
                              pTVar14->msg = pcVar16;
                              pTVar15 = local_80;
                              iVar10 = local_fc;
                            }
                            else if (pTVar14->msg == (char *)0x0) {
                              pTVar14->rtype = CK_ERROR;
                              pcVar16 = (char *)emalloc(100);
                              snprintf(pcVar16,100,"Early exit with return value %d",
                                       (ulong)(uint)(int)cVar18);
                              pTVar14->msg = pcVar16;
                              tc = local_e8;
                              pTVar15 = local_80;
                              iVar10 = local_fc;
                            }
                            else {
                              pTVar14->rtype = CK_FAILURE;
                            }
                          }
                        }
                        else if (__sig == 0) {
                          if (pTVar14->msg != (char *)0x0) {
                            free(pTVar14->msg);
                          }
                          pcVar16 = (char *)emalloc(100);
                          snprintf(pcVar16,100,"Early exit with return value %d",
                                   (ulong)(uint)(int)cVar18);
                          pTVar14->msg = pcVar16;
                          pTVar14->rtype = CK_FAILURE;
                          tc = local_e8;
                          pTVar15 = local_80;
                          iVar10 = local_fc;
                        }
                      }
                      else if (__sig == uVar11) {
                        if (alarm_received == '\x01') {
                          pTVar14->rtype = CK_ERROR;
                          pcVar16 = pTVar14->msg;
LAB_00156c96:
                          if (pcVar16 != (char *)0x0) {
                            free(pcVar16);
                          }
                          pcVar16 = signal_error_msg(__sig,uVar11);
                        }
                        else {
                          pTVar14->rtype = CK_PASS;
                          if (pTVar14->msg != (char *)0x0) {
                            free(pTVar14->msg);
                          }
                          pcVar16 = strdup("Passed");
                        }
                        pTVar14->msg = pcVar16;
                        pTVar15 = local_80;
                        iVar10 = local_fc;
                      }
                      else {
                        pTVar14->rtype = CK_ERROR;
                        pcVar16 = pTVar14->msg;
                        if (uVar11 != 0) goto LAB_00156c96;
                        if (pcVar16 != (char *)0x0) {
                          free(pcVar16);
                        }
                        pcVar16 = (char *)emalloc(100);
                        if (alarm_received == '\x01') {
                          builtin_strncpy(pcVar16,"Test timeout expired",0x15);
                        }
                        else {
                          pcVar17 = strsignal(__sig);
                          snprintf(pcVar16,100,"Received signal %d (%s)",(ulong)__sig,pcVar17);
                        }
                        pTVar14->msg = pcVar16;
                        pTVar15 = local_80;
                        iVar10 = local_fc;
                      }
LAB_00156d29:
                      srunner_add_failure(sr,pTVar14);
                      log_test_end(sr,pTVar14);
                      iVar10 = iVar10 + 1;
                      pTVar6 = local_80;
                    } while (iVar10 < pTVar15->loop_end);
                  }
                  pLVar19 = local_90;
                  check_list_advance(local_90);
                  iVar10 = check_list_at_end(pLVar19);
                } while (iVar10 == 0);
              }
              pLVar19 = tc->unch_tflst;
              fVar9 = srunner_fork_status(sr);
              srunner_run_teardown(pLVar19,fVar9);
              pcVar16 = local_e0;
            }
            else {
              srunner_add_failure(sr,pTVar14);
              pcVar16 = local_e0;
            }
          }
          pLVar19 = local_98;
          check_list_advance(local_98);
          iVar10 = check_list_at_end(pLVar19);
          pLVar4 = local_98;
          pLVar2 = local_98;
        }
        local_98 = pLVar2;
        log_suite_end(sr,local_a0);
        pLVar19 = local_a8;
      }
      check_list_advance(pLVar19);
      iVar10 = check_list_at_end(pLVar19);
      pLVar7 = local_a8;
      pSVar8 = local_b8;
      pLVar2 = local_c0;
      pSVar3 = local_b8;
      pLVar4 = local_a8;
    }
    local_b8 = pSVar3;
    local_a8 = pLVar4;
    check_list_apply(pLVar2,free);
    pLVar19 = local_c8;
    check_list_apply(local_c8,free);
    check_list_free(pLVar2);
    check_list_free(pLVar19);
    log_srunner_end(sr);
    srunner_end_logging(sr);
    teardown_messaging();
    set_fork_status(CK_FORK);
    sigaction(0xe,(sigaction *)&srunner_run_tagged::sigalarm_old_action,(sigaction *)0x0);
    sigaction(2,(sigaction *)&sigint_old_action,(sigaction *)0x0);
    sigaction(0xf,(sigaction *)&sigterm_old_action,(sigaction *)0x0);
  }
  return;
}

Assistant:

void srunner_run_tagged(SRunner * sr, const char *sname, const char *tcname,
                        const char *include_tags, const char *exclude_tags,
                        enum print_output print_mode)
{
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    static struct sigaction sigalarm_old_action;
    static struct sigaction sigalarm_new_action;
    static struct sigaction sigint_new_action;
    static struct sigaction sigterm_new_action;
#endif /* HAVE_SIGACTION && HAVE_FORK */

    /*  Get the selected test suite and test case from the
       environment.  */
    if(!tcname)
        tcname = getenv("CK_RUN_CASE");
    if(!sname)
        sname = getenv("CK_RUN_SUITE");
    if(!include_tags)
        include_tags = getenv("CK_INCLUDE_TAGS");
    if(!exclude_tags)
        exclude_tags = getenv("CK_EXCLUDE_TAGS");

    if(sr == NULL)
        return;
    if(print_mode >= CK_LAST)
    {
        eprintf("Bad print_mode argument to srunner_run_all: %d",
                __FILE__, __LINE__, print_mode);
    }
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    memset(&sigalarm_new_action, 0, sizeof(sigalarm_new_action));
    sigalarm_new_action.sa_handler = sig_handler;
    sigaction(SIGALRM, &sigalarm_new_action, &sigalarm_old_action);

    memset(&sigint_new_action, 0, sizeof(sigint_new_action));
    sigint_new_action.sa_handler = sig_handler;
    sigaction(SIGINT, &sigint_new_action, &sigint_old_action);

    memset(&sigterm_new_action, 0, sizeof(sigterm_new_action));
    sigterm_new_action.sa_handler = sig_handler;
    sigaction(SIGTERM, &sigterm_new_action, &sigterm_old_action);
#endif /* HAVE_SIGACTION && HAVE_FORK */
    srunner_run_init(sr, print_mode);
    srunner_iterate_suites(sr, sname, tcname, include_tags, exclude_tags,
                           print_mode);
    srunner_run_end(sr, print_mode);
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    sigaction(SIGALRM, &sigalarm_old_action, NULL);
    sigaction(SIGINT, &sigint_old_action, NULL);
    sigaction(SIGTERM, &sigterm_old_action, NULL);
#endif /* HAVE_SIGACTION && HAVE_FORK */
}